

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall AsymmetricAlgorithm::isWrappingMech(AsymmetricAlgorithm *this,Type padding)

{
  return (bool)(0x1aU >> ((byte)padding & 0x1f) & padding < RSA_SHA1_PKCS);
}

Assistant:

bool AsymmetricAlgorithm::isWrappingMech(AsymMech::Type padding)
{
	switch (padding)
	{
		case AsymMech::RSA:
		case AsymMech::RSA_PKCS:
		case AsymMech::RSA_PKCS_OAEP:
			return true;

		default:
			return false;
	}
}